

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  uint uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  prVar3 = src_1->runs;
  uVar2 = src_1->n_runs;
  if ((((ulong)uVar2 == 1) && (prVar3->value == 0)) && (prVar3->length == 0xffff)) {
    iVar5 = src_2->cardinality;
  }
  else if ((int)uVar2 < 1) {
    iVar5 = 0;
  }
  else {
    puVar4 = src_2->words;
    uVar12 = 0;
    iVar5 = 0;
    do {
      uVar1 = prVar3[uVar12].value;
      uVar7 = (uint)prVar3[uVar12].length + (uint)uVar1;
      uVar14 = (uint)(uVar1 >> 6);
      uVar8 = uVar7 >> 6;
      bVar6 = (byte)uVar1;
      if (uVar14 == uVar8) {
        uVar13 = puVar4[uVar14] &
                 (0xffffffffffffffffU >> (0x3fU - (char)prVar3[uVar12].length & 0x3f)) <<
                 (bVar6 & 0x3f);
        uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar9 = (uint)(byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38);
      }
      else {
        uVar13 = (puVar4[uVar14] >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
        uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar13 = ((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
        uVar10 = uVar13 >> 0x38;
        uVar9 = (uint)(byte)(uVar13 >> 0x38);
        if (uVar14 + 1 < uVar8) {
          uVar13 = (ulong)(uVar14 + 1);
          do {
            uVar11 = puVar4[uVar13] - (puVar4[uVar13] >> 1 & 0x5555555555555555);
            uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
            uVar9 = (int)uVar10 +
                    (uint)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38);
            uVar10 = (ulong)uVar9;
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        bVar6 = ~(byte)uVar7;
        uVar13 = (puVar4[uVar8] << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
        uVar13 = uVar13 - (uVar13 >> 1 & 0x5555555555555555);
        uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
        uVar9 = (byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
                uVar9;
      }
      iVar5 = iVar5 + uVar9;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar2);
  }
  return iVar5;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}